

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_graph.h
# Opt level: O2

vector<filtered_directed_graph_t,_std::allocator<filtered_directed_graph_t>_> * __thiscall
filtered_directed_graph_t::get_connected_subgraphs
          (vector<filtered_directed_graph_t,_std::allocator<filtered_directed_graph_t>_>
           *__return_storage_ptr__,filtered_directed_graph_t *this,
          vertex_index_t minimal_number_of_vertices)

{
  pointer puVar1;
  pointer puVar2;
  filtered_directed_graph_t *big_graph;
  uint uVar3;
  uint uVar4;
  index_t iVar5;
  ostream *poVar6;
  iterator iVar7;
  _Insert_base<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *this_00;
  undefined6 in_register_00000012;
  __node_base _Var8;
  size_t index;
  ulong uVar9;
  vertex_index_t component;
  vector<filtered_directed_graph_t,_std::allocator<filtered_directed_graph_t>_> *subgraphs;
  pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>
  pair;
  vector<float,_std::allocator<float>_> weights;
  unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
  vertex_set;
  unordered_map<unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>_>_>
  connected_components;
  filtered_union_find dset;
  key_type local_26a;
  vector<filtered_directed_graph_t,_std::allocator<filtered_directed_graph_t>_> *local_268;
  undefined4 local_25c;
  filtered_directed_graph_t *local_258;
  pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>
  local_250;
  _Vector_base<float,_std::allocator<float>_> local_210;
  _Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_1f8;
  _Hashtable<unsigned_short,_std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>,_std::allocator<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_1c0;
  filtered_union_find local_188;
  _Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_140;
  undefined1 local_108 [216];
  
  local_268 = __return_storage_ptr__;
  poVar6 = std::operator<<((ostream *)&std::cout,"\x1b[K");
  std::operator<<(poVar6,"computing connected subgraphs");
  poVar6 = (ostream *)std::ostream::flush();
  std::operator<<(poVar6,"\r");
  local_108._0_4_ = 0.0;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_210,
             (ulong)(this->super_directed_graph_t).number_of_vertices,
             (value_type_conflict2 *)local_108,(allocator_type *)&local_188);
  filtered_union_find::filtered_union_find
            (&local_188,(vector<float,_std::allocator<float>_> *)&local_210);
  puVar1 = (this->super_directed_graph_t).edges.
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (this->super_directed_graph_t).edges.
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar9 = 0; (ulong)((long)puVar1 - (long)puVar2 >> 1) >> 1 != uVar9; uVar9 = uVar9 + 1) {
    uVar3 = filtered_union_find::find
                      (&local_188,
                       (uint)(this->super_directed_graph_t).edges.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar9 * 2]);
    uVar4 = filtered_union_find::find
                      (&local_188,
                       (uint)(this->super_directed_graph_t).edges.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar9 * 2 + 1]);
    if (uVar3 != uVar4) {
      filtered_union_find::link(&local_188,(char *)(ulong)uVar3,(char *)(ulong)uVar4);
    }
  }
  local_25c = (undefined4)CONCAT62(in_register_00000012,minimal_number_of_vertices);
  (local_268->
  super__Vector_base<filtered_directed_graph_t,_std::allocator<filtered_directed_graph_t>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_268->
  super__Vector_base<filtered_directed_graph_t,_std::allocator<filtered_directed_graph_t>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (local_268->
  super__Vector_base<filtered_directed_graph_t,_std::allocator<filtered_directed_graph_t>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c0._M_buckets = &local_1c0._M_single_bucket;
  local_1c0._M_bucket_count = 1;
  local_1c0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1c0._M_element_count = 0;
  local_1c0._M_rehash_policy._M_max_load_factor = 1.0;
  local_1c0._M_rehash_policy._M_next_resize = 0;
  local_1c0._M_single_bucket = (__node_base_ptr)0x0;
  local_1f8._M_buckets._0_2_ = 0;
  local_258 = this;
  while( true ) {
    big_graph = local_258;
    if ((local_258->super_directed_graph_t).number_of_vertices <= (ushort)local_1f8._M_buckets)
    break;
    iVar5 = filtered_union_find::find(&local_188,(uint)(ushort)local_1f8._M_buckets);
    local_26a = (key_type)iVar5;
    iVar7 = std::
            _Hashtable<unsigned_short,_std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>,_std::allocator<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&local_1c0,&local_26a);
    if (iVar7.
        super__Node_iterator_base<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      local_250._0_8_ = &local_250.second._M_h._M_rehash_policy._M_next_resize;
      local_250.second._M_h._M_buckets = (__buckets_ptr)0x1;
      local_250.second._M_h._M_bucket_count = 0;
      local_250.second._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_250.second._M_h._M_element_count = 0x3f800000;
      local_250.second._M_h._M_rehash_policy._0_8_ = 0;
      local_250.second._M_h._M_rehash_policy._M_next_resize = 0;
      local_108._0_2_ = local_26a;
      std::
      _Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_Hashtable((_Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)(local_108 + 8),
                   (_Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)&local_250);
      std::
      _Hashtable<unsigned_short,std::pair<unsigned_short_const,std::unordered_set<unsigned_short,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<unsigned_short>>>,std::allocator<std::pair<unsigned_short_const,std::unordered_set<unsigned_short,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<unsigned_short>>>>,std::__detail::_Select1st,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_emplace<std::pair<unsigned_short,std::unordered_set<unsigned_short,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<unsigned_short>>>>
                ((_Hashtable<unsigned_short,std::pair<unsigned_short_const,std::unordered_set<unsigned_short,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<unsigned_short>>>,std::allocator<std::pair<unsigned_short_const,std::unordered_set<unsigned_short,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<unsigned_short>>>>,std::__detail::_Select1st,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&local_1c0,local_108);
      std::
      _Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)(local_108 + 8));
      std::
      _Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)&local_250);
    }
    this_00 = (_Insert_base<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)std::__detail::
                 _Map_base<unsigned_short,_std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>,_std::allocator<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_short,_std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>,_std::allocator<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_1c0,&local_26a);
    std::__detail::
    _Insert_base<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert(this_00,(value_type *)&local_1f8);
    local_1f8._M_buckets._0_2_ = (ushort)local_1f8._M_buckets + 1;
  }
  uVar9 = (ulong)(ushort)local_25c;
  for (_Var8._M_nxt = local_1c0._M_before_begin._M_nxt; _Var8._M_nxt != (_Hash_node_base *)0x0;
      _Var8._M_nxt = (_Var8._M_nxt)->_M_nxt) {
    std::
    pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>
    ::pair(&local_250,
           (pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>
            *)(_Var8._M_nxt + 1));
    std::
    _Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_Hashtable(&local_1f8,&local_250.second._M_h);
    if (uVar9 <= local_1f8._M_element_count) {
      std::
      _Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_Hashtable(&local_140,&local_1f8);
      filtered_directed_graph_t
                ((filtered_directed_graph_t *)local_108,big_graph,
                 (unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
                  *)&local_140);
      std::vector<filtered_directed_graph_t,_std::allocator<filtered_directed_graph_t>_>::
      emplace_back<filtered_directed_graph_t>(local_268,(filtered_directed_graph_t *)local_108);
      ~filtered_directed_graph_t((filtered_directed_graph_t *)local_108);
      std::
      _Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_140);
    }
    std::
    _Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_1f8);
    std::
    _Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_250.second._M_h);
  }
  std::
  _Hashtable<unsigned_short,_std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>,_std::allocator<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_1c0);
  filtered_union_find::~filtered_union_find(&local_188);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_210);
  return local_268;
}

Assistant:

std::vector<filtered_directed_graph_t> get_connected_subgraphs(vertex_index_t minimal_number_of_vertices) {
#ifdef INDICATE_PROGRESS
		std::cout << "\033[K"
		          << "computing connected subgraphs" << std::flush << "\r";
#endif
		std::vector<value_t> weights(number_of_vertices, 0);
		filtered_union_find dset(weights);
		const auto number_of_edges = edge_number();

		for (size_t index = 0; index < number_of_edges; index++) {
			index_t u = dset.find(edges[2 * index]), v = dset.find(edges[2 * index + 1]);

			if (u != v) dset.link(u, v);
		}

		std::vector<filtered_directed_graph_t> subgraphs;
		{
			std::unordered_map<vertex_index_t, std::unordered_set<vertex_index_t>> connected_components;
			for (vertex_index_t index = 0; index < number_of_vertices; ++index) {
				vertex_index_t component = dset.find(index);
				if (connected_components.find(component) == connected_components.end()) {
					connected_components.insert(std::make_pair(component, std::unordered_set<vertex_index_t>()));
				}

				connected_components[component].insert(index);
			}

			for (auto pair : connected_components) {
				auto vertex_set = pair.second;
				if (vertex_set.size() < minimal_number_of_vertices) continue;
				subgraphs.push_back(filtered_directed_graph_t(this, vertex_set));
			}
		}

		return subgraphs;
	}